

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_type.h
# Opt level: O3

bool date::rfc3339::read<std::istreambuf_iterator<char,std::char_traits<char>>>
               (istreambuf_iterator<char,_std::char_traits<char>_> *pos,
               istreambuf_iterator<char,_std::char_traits<char>_> *end,parts *value)

{
  bool bVar1;
  int_type iVar2;
  int_type iVar3;
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar4;
  short sVar5;
  offset_type offset_minutes;
  offset_type offset_hours;
  short local_bc;
  short local_ba;
  parts local_b8;
  tuple<date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
  local_a8;
  
  piVar4 = skip_spaces<std::istreambuf_iterator<char,std::char_traits<char>>>(pos,end);
  pos->_M_sbuf = piVar4->_M_sbuf;
  pos->_M_c = piVar4->_M_c;
  iVar2 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(pos);
  iVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(end);
  if ((iVar3 != -1) == (iVar2 == -1)) {
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_false>._M_head_impl.
    value = (unsigned_integer_t<unsigned_char,_2U,_2U>)&local_b8.month;
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_false>._M_head_impl.
    value = (unsigned_integer_t<unsigned_char,_2U,_2U>)&local_b8.day;
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_false>._M_head_impl.
    value = (unsigned_integer_t<unsigned_char,_2U,_2U>)&local_b8.hour;
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<7UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<8UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<8UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_false>._M_head_impl.
    value = (unsigned_integer_t<unsigned_char,_2U,_2U>)&local_b8.minute;
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<7UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<8UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<9UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<10UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<10UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_false>._M_head_impl.
    value = (unsigned_integer_t<unsigned_char,_2U,_2U>)&local_b8.second;
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<7UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<8UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<9UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<10UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<11UL,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Head_base<11UL,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_false>
    ._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>.
    super__Tuple_impl<1UL,_date::fraction_t<unsigned_int,_9U>_>.
    super__Head_base<1UL,_date::fraction_t<unsigned_int,_9U>,_false>._M_head_impl.value =
         (_Head_base<1UL,_date::fraction_t<unsigned_int,_9U>,_false>)&local_b8.nanosecond;
    local_b8.year = 0;
    local_b8.month = '\0';
    local_b8.day = '\0';
    local_b8.hour = '\0';
    local_b8.minute = '\0';
    local_b8.second = '\0';
    local_b8._7_1_ = 0;
    local_b8.nanosecond = 0;
    local_b8.offset_in_minutes = 0;
    local_b8._14_2_ = 0;
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<7UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<8UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<9UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<10UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<11UL,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<12UL,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Head_base<12UL,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>,_false>
    ._M_head_impl.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Tuple_impl<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Head_base<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>,_false>
    ._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>
    .super__Head_base<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_false>._M_head_impl.value =
         (signed_integer_t<short,_2U,_2U,_true>)&local_ba;
    local_ba = 0;
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<7UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<8UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<9UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<10UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<11UL,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<12UL,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Head_base<12UL,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>,_false>
    ._M_head_impl.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Tuple_impl<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Head_base<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>,_false>
    ._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>
    .super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>.
    super__Tuple_impl<2UL,_date::unsigned_integer_t<short,_2U,_2U>_>.
    super__Head_base<2UL,_date::unsigned_integer_t<short,_2U,_2U>,_false>._M_head_impl.value =
         (_Head_base<2UL,_date::unsigned_integer_t<short,_2U,_2U>,_false>)&local_bc;
    local_bc = 0;
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<7UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<8UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<9UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<10UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<11UL,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<12UL,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Head_base<12UL,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>,_false>
    ._M_head_impl.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Tuple_impl<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .
    super__Head_base<1UL,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>,_false>
    ._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>
    .super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>.
    super__Head_base<1UL,_date::character_t<char>,_false>._M_head_impl.value =
         (character_t<char>)':';
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<7UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<8UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<9UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<10UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<11UL,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<12UL,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Head_base<12UL,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>,_false>
    ._M_head_impl.branches.
    super__Tuple_impl<0UL,_date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
    .super__Head_base<0UL,_date::branch_t<date::character_t<char>_>,_false>._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::character_t<char>_>.
    super__Head_base<0UL,_date::character_t<char>,_false>._M_head_impl.value =
         (branch_t<date::character_t<char>_>)(tuple<date::character_t<char>_>)0x5a;
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<7UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<8UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<9UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<10UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<11UL,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Head_base<11UL,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_false>
    ._M_head_impl.formatters.
    super__Tuple_impl<0UL,_date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>.
    super__Head_base<0UL,_date::character_t<char>,_false>._M_head_impl.value =
         (character_t<char>)'.';
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<7UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<8UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<9UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<9UL,_date::character_t<char>,_false>._M_head_impl.value =
         (character_t<char>)':';
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<6UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<7UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<7UL,_date::character_t<char>,_false>._M_head_impl.value =
         (character_t<char>)':';
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<4UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<5UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<5UL,_date::character_t<char>,_false>._M_head_impl.value =
         (character_t<char>)'T';
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<2UL,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<3UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<3UL,_date::character_t<char>,_false>._M_head_impl.value =
         (character_t<char>)'-';
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .
    super__Tuple_impl<1UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<1UL,_date::character_t<char>,_false>._M_head_impl.value =
         (character_t<char>)'-';
    local_a8.
    super__Tuple_impl<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_>,_date::cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
    .super__Head_base<0UL,_date::unsigned_integer_t<unsigned_short,_4U,_4U>,_false>._M_head_impl.
    value = (unsigned_integer_t<unsigned_short,_4U,_4U>)&local_b8;
    bVar1 = read<std::istreambuf_iterator<char,std::char_traits<char>>,date::unsigned_integer_t<unsigned_short,4u,4u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::optional_t<date::character_t<char>,date::fraction_t<unsigned_int,9u>>,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>>
                      (pos,end,&local_a8);
    if (!bVar1) {
      return false;
    }
    bVar1 = validate(&local_b8);
    if (bVar1) {
      value->nanosecond = local_b8.nanosecond;
      value->year = local_b8.year;
      value->month = local_b8.month;
      value->day = local_b8.day;
      value->hour = local_b8.hour;
      value->minute = local_b8.minute;
      value->second = local_b8.second;
      value->field_0x7 = local_b8._7_1_;
      sVar5 = -local_bc;
      if (0 < local_ba) {
        sVar5 = local_bc;
      }
      value->offset_in_minutes = sVar5 + local_ba * 0x3c;
      return true;
    }
  }
  return false;
}

Assistant:

static bool read(Iterator& pos, const Iterator& end, parts& value)
    {
        using char_type = typename iterator_traits<Iterator>::value_type;

        pos = skip_spaces(pos, end);
        if (pos == end)
            return false;

        parts dt{};
        std::memset(static_cast<void*>(&dt), 0, sizeof(parts));

        offset_type offset_hours = 0;
        offset_type offset_minutes = 0;
        auto fmt = format(
            unsigned_integer<4, 4>(dt.year),   character<char_type>('-'),
            unsigned_integer<2, 2>(dt.month),  character<char_type>('-'),
            unsigned_integer<2, 2>(dt.day),    character<char_type>('T'),
            unsigned_integer<2, 2>(dt.hour),   character<char_type>(':'),
            unsigned_integer<2, 2>(dt.minute), character<char_type>(':'),
            unsigned_integer<2, 2>(dt.second),
            optional(
                character<char_type>('.'),
                fraction<9>(dt.nanosecond)),
            cases(
                branch(
                    character<char_type>('Z')),
                branch(
                    signed_integer<2, 2, SignRequired>(offset_hours),
                    character<char_type>(':'),
                    unsigned_integer<2, 2>(offset_minutes))));

        if (!::date::read(pos, end, fmt) || !validate(dt))
            return false;

        value = dt;
        value.offset_in_minutes = offset_hours * 60 + (offset_hours > 0 ? offset_minutes : -offset_minutes);
        return true;
    }